

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_component_argument_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  uint32_t __val;
  CompilerError *this_00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = Compiler::evaluate_constant_u32((Compiler *)this,id);
  switch(__val) {
  case 0:
    pcVar1 = "component::x";
    break;
  case 1:
    pcVar1 = "component::y";
    break;
  case 2:
    pcVar1 = "component::z";
    break;
  case 3:
    pcVar1 = "component::w";
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::to_string(&local_98,__val);
    ::std::operator+(&local_78,"The value (",&local_98);
    ::std::operator+(&local_58,&local_78,") of OpConstant ID ");
    ::std::__cxx11::to_string(&local_b8,id);
    ::std::operator+(&local_38,&local_58,&local_b8);
    ::std::operator+(&bStack_d8,&local_38,
                     " is not a valid Component index, which must be one of 0, 1, 2, or 3.");
    CompilerError::CompilerError(this_00,&bStack_d8);
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&bStack_d8);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_component_argument(uint32_t id)
{
	uint32_t component_index = evaluate_constant_u32(id);
	switch (component_index)
	{
	case 0:
		return "component::x";
	case 1:
		return "component::y";
	case 2:
		return "component::z";
	case 3:
		return "component::w";

	default:
		SPIRV_CROSS_THROW("The value (" + to_string(component_index) + ") of OpConstant ID " + to_string(id) +
		                  " is not a valid Component index, which must be one of 0, 1, 2, or 3.");
		return "component::x";
	}
}